

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::EndQuery
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IQuery *pQuery,int param_2)

{
  QUERY_TYPE QueryType;
  COMMAND_QUEUE_TYPE CVar1;
  int iVar2;
  undefined4 extraout_var;
  COMMAND_QUEUE_TYPE CVar3;
  COMMAND_QUEUE_TYPE Type;
  string msg;
  char (*in_stack_ffffffffffffff88) [8];
  string local_70;
  char *local_50;
  String local_48;
  
  if (pQuery == (IQuery *)0x0) {
    FormatString<char[50]>
              (&local_70,(char (*) [50])"IDeviceContext::EndQuery: pQuery must not be null");
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x698);
    std::__cxx11::string::~string((string *)&local_70);
  }
  iVar2 = (*(pQuery->super_IDeviceObject).super_IObject._vptr_IObject[4])(pQuery);
  QueryType = *(QUERY_TYPE *)(CONCAT44(extraout_var,iVar2) + 8);
  CVar1 = (this->m_Desc).QueueType;
  if (CVar1 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_70,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x69c);
      std::__cxx11::string::~string((string *)&local_70);
    }
    FormatString<char[97]>
              (&local_70,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x69c);
    std::__cxx11::string::~string((string *)&local_70);
    CVar1 = (this->m_Desc).QueueType;
  }
  CVar3 = ~COMMAND_QUEUE_TYPE_GRAPHICS;
  if ((QueryType - QUERY_TYPE_TIMESTAMP & 0xfffffffd) == 0) {
    CVar3 = ~COMMAND_QUEUE_TYPE_TRANSFER;
  }
  if ((CVar3 | CVar1) != ~COMMAND_QUEUE_TYPE_UNKNOWN) {
    local_50 = GetQueryTypeString(QueryType);
    GetCommandQueueTypeString_abi_cxx11_(&local_48,(Diligent *)(ulong)(this->m_Desc).QueueType,Type)
    ;
    FormatString<char[25],char_const*,char[22],std::__cxx11::string,char[8]>
              (&local_70,(Diligent *)"EndQuery for query type ",(char (*) [25])&local_50,
               (char **)0x65e20a,(char (*) [22])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
               in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&local_48);
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x69c);
    std::__cxx11::string::~string((string *)&local_70);
  }
  CheckDynamicType<Diligent::QueryVkImpl,Diligent::IQuery>(pQuery);
  QueryVkImpl::OnEndQuery((QueryVkImpl *)pQuery,(DeviceContextVkImpl *)this);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::EndQuery(IQuery* pQuery, int)
{
    DEV_CHECK_ERR(pQuery != nullptr, "IDeviceContext::EndQuery: pQuery must not be null");

    const QUERY_TYPE         QueryType = pQuery->GetDesc().Type;
    const COMMAND_QUEUE_TYPE QueueType = QueryType == QUERY_TYPE_DURATION || QueryType == QUERY_TYPE_TIMESTAMP ? COMMAND_QUEUE_TYPE_TRANSFER : COMMAND_QUEUE_TYPE_GRAPHICS;
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(QueueType, "EndQuery for query type ", GetQueryTypeString(QueryType));

    ClassPtrCast<QueryImplType>(pQuery)->OnEndQuery(static_cast<DeviceContextImplType*>(this));
}